

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poisson.c
# Opt level: O2

void compFG(double **U,double **V,double **F,double **G,char **FLAG,double delt,lattice *grid,
           fluidSim *simulation)

{
  byte bVar1;
  int iVar2;
  double *pdVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  long lVar6;
  double **ppdVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  
  dVar12 = grid->delx * grid->delx;
  dVar15 = grid->dely * grid->dely;
  iVar2 = grid->deli;
  lVar6 = (long)iVar2;
  lVar11 = 0;
  do {
    lVar9 = lVar11;
    if (lVar6 < lVar9) {
      iVar8 = 0;
      if (0 < iVar2) {
        iVar8 = iVar2;
      }
      for (uVar10 = 1; uVar10 != iVar8 + 1; uVar10 = uVar10 + 1) {
        iVar2 = grid->delj;
        for (lVar11 = 0; lVar11 <= iVar2; lVar11 = lVar11 + 1) {
          bVar1 = FLAG[uVar10][lVar11];
          if (bVar1 == 0xf) {
            pdVar3 = V[uVar10];
            dVar16 = pdVar3[lVar11 + 1];
            auVar19._0_8_ =
                 V[uVar10 - 1][lVar11 + 1] + (V[uVar10 + 1][lVar11 + 1] - (dVar16 + dVar16));
            auVar19._8_8_ = pdVar3[lVar11] + (pdVar3[lVar11 + 2] - (dVar16 + dVar16));
            auVar18._8_8_ = dVar15;
            auVar18._0_8_ = dVar12;
            auVar18 = divpd(auVar19,auVar18);
            dVar14 = simulation->alpha;
            dVar13 = delUVbyDelZ(U,V,(int)uVar10,(int)lVar11,1,dVar14,grid->delx);
            dVar14 = delXSqrdByDelZ(V,(int)uVar10,(int)lVar11 + 1,2,dVar14,grid->dely);
            local_68 = auVar18._0_8_;
            dStack_60 = auVar18._8_8_;
            G[uVar10][lVar11] =
                 ((((dStack_60 + local_68) / simulation->Re - dVar14) - dVar13) + simulation->GY) *
                 delt + dVar16;
          }
          else if ((bVar1 & 1) == 0) {
            if ((bVar1 & 4) != 0) {
              G[uVar10][lVar11 + -1] = V[uVar10 - 1][lVar11];
            }
          }
          else {
            G[uVar10][lVar11] = V[uVar10][lVar11 + 1];
          }
        }
      }
      bVar1 = grid->edges;
      if ((bVar1 & 4) != 0) {
        iVar2 = grid->delj;
        for (lVar11 = 0; lVar11 <= iVar2; lVar11 = lVar11 + 1) {
          (*F)[lVar11] = U[1][lVar11];
        }
      }
      if ((bVar1 & 8) != 0) {
        iVar2 = grid->delj;
        for (lVar11 = 0; lVar11 <= iVar2; lVar11 = lVar11 + 1) {
          F[lVar6][lVar11] = U[lVar6 + 1][lVar11];
        }
      }
      if ((bVar1 & 2) != 0) {
        for (lVar11 = 0; lVar11 <= lVar6; lVar11 = lVar11 + 1) {
          *G[lVar11] = V[lVar11][1];
        }
      }
      if ((bVar1 & 1) != 0) {
        for (lVar11 = 0; lVar11 <= lVar6; lVar11 = lVar11 + 1) {
          G[lVar11][grid->delj] = V[lVar11][(long)grid->delj + 1];
        }
      }
      return;
    }
    lVar11 = lVar9 + 1;
    uVar4 = grid->delj;
    if (grid->delj < 1) {
      uVar4 = 0;
    }
    for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
      bVar1 = FLAG[lVar9][uVar10 + 1];
      ppdVar7 = F;
      if (bVar1 == 0xf) {
        pdVar3 = U[lVar11];
        dVar16 = pdVar3[uVar10 + 1];
        auVar17._0_8_ = U[lVar9][uVar10 + 1] + (U[lVar9 + 2][uVar10 + 1] - (dVar16 + dVar16));
        auVar17._8_8_ = pdVar3[uVar10] + (pdVar3[uVar10 + 2] - (dVar16 + dVar16));
        auVar5._8_8_ = dVar15;
        auVar5._0_8_ = dVar12;
        auVar18 = divpd(auVar17,auVar5);
        dVar14 = simulation->alpha;
        iVar8 = (int)uVar10 + 1;
        dVar13 = delUVbyDelZ(U,V,(int)lVar9,iVar8,2,dVar14,grid->dely);
        dVar14 = delXSqrdByDelZ(U,(int)lVar11,iVar8,1,dVar14,grid->delx);
        local_78 = auVar18._0_8_;
        dStack_70 = auVar18._8_8_;
        dVar16 = ((((dStack_70 + local_78) / simulation->Re - dVar14) - dVar13) + simulation->GX) *
                 delt + dVar16;
LAB_00103914:
        ppdVar7[lVar9][uVar10 + 1] = dVar16;
      }
      else {
        if ((bVar1 & 2) != 0) {
          dVar16 = U[lVar9 + 1][uVar10 + 1];
          goto LAB_00103914;
        }
        if ((bVar1 & 8) != 0) {
          dVar16 = U[lVar9][uVar10 + 1];
          ppdVar7 = F + -1;
          goto LAB_00103914;
        }
      }
    }
  } while( true );
}

Assistant:

void    compFG (REAL **U, REAL **V, REAL **F, REAL **G, char **FLAG, REAL delt,
		lattice *grid, fluidSim *simulation)
{
	/* Compute the auxiliary arrays F and G */
	REAL d2ux, d2uy, d2vx, d2vy;
	REAL du2x, dv2y;
	REAL duvx, duvy;
	REAL dxSqrd = sqr(grid->delx);
	REAL dySqrd = sqr(grid->dely);
	short flag;
	int i,j;
	for (i = 0; i <= grid->deli; i++)
	{
		for (j = 1; j <= grid->delj; j++)
		{
			flag = FLAG[i][j];
			if (flag == C_F) /* Pure fluid cells */
			{
				/* !! Notice: The index of F is shifted to match that of U! This computes the boundary condition of U!
				 * Therefore there is no shift in i-direction here!! */
				d2ux = (U[i+2][j] - 2*U[i+1][j] + U[i][j])/dxSqrd;
				d2uy = (U[i+1][j+1] - 2*U[i+1][j] + U[i+1][j-1])/dySqrd;

				duvy = delUVbyDelZ(U,V,i,j,DERIVE_BY_Y,simulation->alpha,grid->dely);
				du2x = delXSqrdByDelZ(U,i+1,j,DERIVE_BY_X,simulation->alpha,grid->delx);

				F[i][j] = U[i+1][j] + delt*((d2ux+d2uy)/simulation->Re - du2x - duvy + simulation->GX);
			}
			else if (flag & B_O)       /* East */
				F[i][j] = U[i+1][j];
			else if (flag & B_W)  /* West */
				F[i-1][j] = U[i][j];
		}
	}
	for (i = 1; i <= grid->deli; i++)
	{
		for (j = 0; j <= grid->delj; j++)
		{
			flag = FLAG[i][j];
			if (flag == C_F) /* Pure fluid cells */
			{
				/* A similar shift holds for G, except in the j-direction! */
				d2vx = (V[i+1][j+1] - 2*V[i][j+1] + V[i-1][j+1])/dxSqrd;
				d2vy = (V[i][j+2] - 2*V[i][j+1] + V[i][j])/dySqrd;

				duvx = delUVbyDelZ(U,V,i,j,DERIVE_BY_X,simulation->alpha,grid->delx);
				dv2y = delXSqrdByDelZ(V,i,j+1,DERIVE_BY_Y,simulation->alpha,grid->dely);

				G[i][j] = V[i][j+1] + delt*((d2vx+d2vy)/simulation->Re - dv2y - duvx + simulation->GY);
			}
			else if (flag & B_N)       /* North */
				G[i][j] = V[i][j+1];
			else if (flag & B_S)  /* South */
				G[i][j-1] = V[i-1][j];
		}
	}
	if (grid->edges & LEFT)
	{
		for (j = 0; j < grid->delj+1; j++)
			F[0][j] = U[1][j];
	}
	if (grid->edges & RIGHT)
	{
		for (j = 0; j < grid->delj+1; j++)
			F[grid->deli][j] = U[grid->deli+1][j];
	}
	if (grid->edges & BOTTOM)
	{
		for (i = 0; i < grid->deli+1; i++)
			G[i][0] = V[i][1];
	}
	if (grid->edges & TOP)
	{
		for (i = 0; i < grid->deli+1; i++)
			G[i][grid->delj] = V[i][grid->delj+1];
	}
	return;
}